

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPrecompileHeadersCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_5f1693::TargetPrecompileHeadersImpl::HandleMissingTarget
          (TargetPrecompileHeadersImpl *this,string *name)

{
  cmMakefile *this_00;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  string *local_18;
  string *name_local;
  TargetPrecompileHeadersImpl *this_local;
  
  this_00 = (this->super_cmTargetPropCommandBase).Makefile;
  local_18 = name;
  name_local = (string *)this;
  cmAlphaNum::cmAlphaNum(&local_68,"Cannot specify precompile headers for target \"");
  cmAlphaNum::cmAlphaNum(&local_98,local_18);
  cmStrCat<char[38]>(&local_38,&local_68,&local_98,
                     (char (*) [38])"\" which is not built by this project.");
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void HandleMissingTarget(const std::string& name) override
  {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Cannot specify precompile headers for target \"", name,
               "\" which is not built by this project."));
  }